

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O2

Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
* __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
::operator+=(Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
             *this,Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
                   *column)

{
  ID_index IVar1;
  Dimension DVar2;
  bool bVar3;
  
  bVar3 = Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
          ::
          _add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
                    ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
                      *)this,column);
  if (bVar3) {
    IVar1 = (this->super_Chain_column_option).pivot_;
    (this->super_Chain_column_option).pivot_ = (column->super_Chain_column_option).pivot_;
    (column->super_Chain_column_option).pivot_ = IVar1;
    DVar2 = (this->super_Column_dimension_option).dim_;
    (this->super_Column_dimension_option).dim_ = (column->super_Column_dimension_option).dim_;
    (column->super_Column_dimension_option).dim_ = DVar2;
  }
  return this;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>& Naive_vector_column<Master_matrix,Support>::operator+=(Naive_vector_column& column)
{
  if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
    // assumes that the addition never zeros out this column.
    if (_add(column)) {
      Chain_opt::swap_pivots(column);
      Dim_opt::swap_dimension(column);
    }
  } else {
    _add(column);
  }

  return *this;
}